

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O2

int Abc_TtSupportSize(word *t,int nVars)

{
  int iVar1;
  int iVar;
  int iVar2;
  int iVar3;
  
  iVar = 0;
  iVar2 = 0;
  if (0 < nVars) {
    iVar2 = nVars;
  }
  iVar3 = 0;
  for (; iVar2 != iVar; iVar = iVar + 1) {
    iVar1 = Abc_TtHasVar(t,nVars,iVar);
    iVar3 = iVar3 + iVar1;
  }
  return iVar3;
}

Assistant:

static inline int Abc_TtSupportSize( word * t, int nVars )
{
    int v, SuppSize = 0;
    for ( v = 0; v < nVars; v++ )
        if ( Abc_TtHasVar( t, nVars, v ) )
            SuppSize++;
    return SuppSize;
}